

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O1

int run_test_tty_file(void)

{
  int iVar1;
  uint uVar2;
  long *unaff_RBX;
  ulong *puVar3;
  int64_t eval_b_10;
  int64_t eval_b_12;
  uv_tty_t tty_wo;
  uv_tty_t tty_ro;
  uv_tty_t tty;
  uv_loop_t loop;
  ulong uStack_c10;
  ulong uStack_c08;
  int iStack_c00;
  int iStack_bfc;
  undefined1 auStack_bf8 [8];
  long alStack_bf0 [7];
  byte bStack_bb6;
  undefined8 auStack_ad8 [7];
  uint uStack_aa0;
  undefined1 auStack_9c0 [808];
  long *plStack_698;
  long local_678 [35];
  long local_560 [35];
  long local_448 [35];
  long local_330 [101];
  
  iVar1 = uv_loop_init(local_330);
  local_448[0] = (long)iVar1;
  local_560[0] = 0;
  if (local_448[0] == 0) {
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (long *)(ulong)uVar2;
      local_560[0] = -0x16;
      iVar1 = uv_tty_init(local_330,local_448,uVar2,1);
      local_678[0] = (long)iVar1;
      if (local_560[0] != local_678[0]) goto LAB_001d8a63;
      iVar1 = close(uVar2);
      local_560[0] = (long)iVar1;
      local_678[0] = 0;
      if (local_560[0] != 0) goto LAB_001d8a75;
      local_560[0] = -0x16;
      iVar1 = uv_tty_init(local_330,local_448,uVar2,1);
      local_678[0] = (long)iVar1;
      if (local_560[0] == local_678[0]) goto LAB_001d8615;
      goto LAB_001d8a99;
    }
LAB_001d8615:
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (long *)(ulong)uVar2;
      local_560[0] = -0x16;
      iVar1 = uv_tty_init(local_330,local_448,uVar2,1);
      local_678[0] = (long)iVar1;
      if (local_560[0] != local_678[0]) goto LAB_001d8a87;
      iVar1 = close(uVar2);
      local_560[0] = (long)iVar1;
      local_678[0] = 0;
      if (local_560[0] == 0) goto LAB_001d869b;
      goto LAB_001d8aab;
    }
LAB_001d869b:
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (long *)(ulong)uVar2;
      local_560[0] = -0x16;
      iVar1 = uv_tty_init(local_330,local_448,uVar2,1);
      local_678[0] = (long)iVar1;
      if (local_560[0] != local_678[0]) goto LAB_001d8abd;
      iVar1 = close(uVar2);
      local_560[0] = (long)iVar1;
      local_678[0] = 0;
      if (local_560[0] == 0) goto LAB_001d8721;
      goto LAB_001d8acf;
    }
LAB_001d8721:
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (long *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_330,local_448,uVar2,1);
      local_560[0] = (long)iVar1;
      local_678[0] = 0;
      if (local_560[0] != 0) goto LAB_001d8ae1;
      iVar1 = close(uVar2);
      local_560[0] = (long)iVar1;
      local_678[0] = 0;
      if (local_560[0] != 0) goto LAB_001d8af3;
      iVar1 = uv_is_readable(local_448);
      if (iVar1 == 0) goto LAB_001d8b05;
      iVar1 = uv_is_writable(local_448);
      if (iVar1 == 0) goto LAB_001d8b0a;
      unaff_RBX = local_448;
      uv_close(unaff_RBX);
      iVar1 = uv_is_readable(unaff_RBX);
      if (iVar1 != 0) goto LAB_001d8b1c;
      iVar1 = uv_is_writable(local_448);
      if (iVar1 == 0) goto LAB_001d880f;
      goto LAB_001d8b2e;
    }
LAB_001d880f:
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      unaff_RBX = (long *)(ulong)uVar2;
      iVar1 = uv_tty_init(local_330,local_560,uVar2,1);
      local_678[0] = (long)iVar1;
      if (local_678[0] != 0) goto LAB_001d8b0f;
      iVar1 = close(uVar2);
      local_678[0] = (long)iVar1;
      if (local_678[0] != 0) goto LAB_001d8b21;
      iVar1 = uv_is_readable(local_560);
      if (iVar1 == 0) goto LAB_001d8b33;
      iVar1 = uv_is_writable(local_560);
      if (iVar1 != 0) goto LAB_001d8b38;
      unaff_RBX = local_560;
      uv_close(unaff_RBX,0);
      iVar1 = uv_is_readable(unaff_RBX);
      if (iVar1 != 0) goto LAB_001d8b4a;
      iVar1 = uv_is_writable(local_560);
      if (iVar1 == 0) goto LAB_001d88ea;
      goto LAB_001d8b5c;
    }
LAB_001d88ea:
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_001d89b6:
      iVar1 = uv_run(local_330,0);
      if (iVar1 != 0) goto LAB_001d8a49;
      unaff_RBX = local_330;
      uv_walk(unaff_RBX,close_walk_cb,0);
      uv_run(unaff_RBX,0);
      iVar1 = uv_loop_close(unaff_RBX);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8a56;
    }
    unaff_RBX = (long *)(ulong)uVar2;
    iVar1 = uv_tty_init(local_330,local_678,uVar2,0);
    if (iVar1 != 0) goto LAB_001d8b3d;
    iVar1 = close(uVar2);
    if (iVar1 != 0) goto LAB_001d8b4f;
    iVar1 = uv_is_readable(local_678);
    if (iVar1 != 0) goto LAB_001d8b61;
    iVar1 = uv_is_writable(local_678);
    if (iVar1 == 0) goto LAB_001d8b66;
    unaff_RBX = local_678;
    uv_close(unaff_RBX,0);
    iVar1 = uv_is_readable(unaff_RBX);
    if (iVar1 != 0) goto LAB_001d8b6b;
    iVar1 = uv_is_writable(local_678);
    if (iVar1 == 0) goto LAB_001d89b6;
  }
  else {
    run_test_tty_file_cold_1();
LAB_001d8a49:
    run_test_tty_file_cold_27();
LAB_001d8a56:
    run_test_tty_file_cold_28();
LAB_001d8a63:
    run_test_tty_file_cold_2();
LAB_001d8a75:
    run_test_tty_file_cold_3();
LAB_001d8a87:
    run_test_tty_file_cold_5();
LAB_001d8a99:
    run_test_tty_file_cold_4();
LAB_001d8aab:
    run_test_tty_file_cold_6();
LAB_001d8abd:
    run_test_tty_file_cold_7();
LAB_001d8acf:
    run_test_tty_file_cold_8();
LAB_001d8ae1:
    run_test_tty_file_cold_9();
LAB_001d8af3:
    run_test_tty_file_cold_10();
LAB_001d8b05:
    run_test_tty_file_cold_14();
LAB_001d8b0a:
    run_test_tty_file_cold_13();
LAB_001d8b0f:
    run_test_tty_file_cold_15();
LAB_001d8b1c:
    run_test_tty_file_cold_11();
LAB_001d8b21:
    run_test_tty_file_cold_16();
LAB_001d8b2e:
    run_test_tty_file_cold_12();
LAB_001d8b33:
    run_test_tty_file_cold_20();
LAB_001d8b38:
    run_test_tty_file_cold_17();
LAB_001d8b3d:
    run_test_tty_file_cold_21();
LAB_001d8b4a:
    run_test_tty_file_cold_18();
LAB_001d8b4f:
    run_test_tty_file_cold_22();
LAB_001d8b5c:
    run_test_tty_file_cold_19();
LAB_001d8b61:
    run_test_tty_file_cold_23();
LAB_001d8b66:
    run_test_tty_file_cold_26();
LAB_001d8b6b:
    run_test_tty_file_cold_24();
  }
  run_test_tty_file_cold_25();
  puVar3 = &uStack_c10;
  plStack_698 = unaff_RBX;
  iVar1 = uv_loop_init(auStack_9c0);
  alStack_bf0[0] = (long)iVar1;
  auStack_ad8[0] = 0;
  if (alStack_bf0[0] == 0) {
    iVar1 = openpty(&iStack_bfc,&iStack_c00,0,0,auStack_bf8);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 7;
    }
    iVar1 = uv_tty_init(auStack_9c0,auStack_ad8,iStack_c00,0);
    alStack_bf0[0] = (long)iVar1;
    uStack_c10 = 0;
    if (alStack_bf0[0] != 0) goto LAB_001d8dd3;
    iVar1 = uv_tty_init(auStack_9c0,alStack_bf0,iStack_bfc,0);
    uStack_c10 = (ulong)iVar1;
    uStack_c08 = 0;
    if (uStack_c10 != 0) goto LAB_001d8de0;
    iVar1 = uv_is_readable(auStack_ad8);
    if (iVar1 == 0) goto LAB_001d8ded;
    iVar1 = uv_is_writable(auStack_ad8);
    if (iVar1 == 0) goto LAB_001d8df2;
    iVar1 = uv_is_readable(alStack_bf0);
    if (iVar1 == 0) goto LAB_001d8df7;
    iVar1 = uv_is_writable(alStack_bf0);
    if (iVar1 == 0) goto LAB_001d8dfc;
    uStack_c10 = (ulong)(uStack_aa0 & 0x100000);
    uStack_c08 = 0;
    if (uStack_c10 != 0) goto LAB_001d8e01;
    if ((bStack_bb6 & 0x10) == 0) goto LAB_001d8e0e;
    iVar1 = close(iStack_c00);
    uStack_c10 = (ulong)iVar1;
    uStack_c08 = 0;
    if (uStack_c10 != 0) goto LAB_001d8e13;
    uv_close(auStack_ad8,0);
    iVar1 = close(iStack_bfc);
    uStack_c10 = (ulong)iVar1;
    uStack_c08 = 0;
    if (uStack_c10 != 0) goto LAB_001d8e20;
    uv_close(alStack_bf0,0);
    iVar1 = uv_run(auStack_9c0,0);
    uStack_c10 = (ulong)iVar1;
    uStack_c08 = 0;
    if (uStack_c10 == 0) {
      uv_walk(auStack_9c0,close_walk_cb,0);
      uv_run(auStack_9c0,0);
      uStack_c10 = 0;
      iVar1 = uv_loop_close(auStack_9c0);
      uStack_c08 = (ulong)iVar1;
      if (uStack_c10 == uStack_c08) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d8e3a;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d8dd3:
    run_test_tty_pty_cold_3();
LAB_001d8de0:
    run_test_tty_pty_cold_4();
LAB_001d8ded:
    run_test_tty_pty_cold_14();
LAB_001d8df2:
    run_test_tty_pty_cold_13();
LAB_001d8df7:
    run_test_tty_pty_cold_12();
LAB_001d8dfc:
    run_test_tty_pty_cold_11();
LAB_001d8e01:
    run_test_tty_pty_cold_5();
LAB_001d8e0e:
    run_test_tty_pty_cold_10();
LAB_001d8e13:
    run_test_tty_pty_cold_6();
LAB_001d8e20:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d8e3a:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing();
  if (iVar1 == 0) {
    iVar1 = uv_close(puVar3,0);
    return iVar1;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tty_file) {
#ifndef _WIN32
  uv_loop_t loop;
  uv_tty_t tty;
  uv_tty_t tty_ro;
  uv_tty_t tty_wo;
  int fd;

  ASSERT_OK(uv_loop_init(&loop));

  fd = open("test/fixtures/empty_file", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
    /* test EBADF handling */
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
  }

/* Bug on AIX where '/dev/random' returns 1 from isatty() */
#ifndef _AIX
  fd = open("/dev/random", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }
#endif /* _AIX */

  fd = open("/dev/zero", O_RDONLY);
  if (fd != -1) {
    ASSERT_EQ(UV_EINVAL, uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd));
  }

  fd = open("/dev/tty", O_RDWR);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(uv_is_writable((uv_stream_t*) &tty));
    uv_close((uv_handle_t*) &tty, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  fd = open("/dev/tty", O_RDONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_ro, fd, 1));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
    uv_close((uv_handle_t*) &tty_ro, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_ro));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_ro));
  }

  fd = open("/dev/tty", O_WRONLY);
  if (fd != -1) {
    ASSERT_OK(uv_tty_init(&loop, &tty_wo, fd, 0));
    ASSERT_OK(close(fd)); /* TODO: it's indeterminate who owns fd now */
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(uv_is_writable((uv_stream_t*) &tty_wo));
    uv_close((uv_handle_t*) &tty_wo, NULL);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty_wo));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty_wo));
  }


  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(&loop);
#endif
  return 0;
}